

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O2

void __thiscall catalog::print(catalog *this)

{
  TableInfo *pTVar1;
  int iVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  iterator iVar4;
  int i;
  long lVar5;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  for (lVar5 = 0; lVar5 < this->tableNumber; lVar5 = lVar5 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"tableName : ");
    std::operator<<(poVar3,(string *)
                           (this->TableInfoList).
                           super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar5]);
    poVar3 = std::operator<<((ostream *)&std::cout,"\tattributeNum : ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(this->TableInfoList).
                               super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl
                               .super__Vector_impl_data._M_start[lVar5]->attributeNum);
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar2 = 0;
    while( true ) {
      uStack_38 = CONCAT44(iVar2,(undefined4)uStack_38);
      pTVar1 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar5];
      if (pTVar1->attributeNum <= iVar2) break;
      poVar3 = std::operator<<((ostream *)&std::cout,
                               (string *)
                               ((long)iVar2 * 0x20 +
                               *(long *)&(pTVar1->attributeName).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data));
      poVar3 = std::operator<<(poVar3,"\t");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,*(int *)(*(long *)&((this->TableInfoList).
                                                                                                          
                                                  super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar5]->
                                                  type).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data +
                                         (long)uStack_38._4_4_ * 4));
      poVar3 = std::operator<<(poVar3,"\t");
      std::ostream::operator<<
                (poVar3,*(int *)(*(long *)&((this->TableInfoList).
                                            super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar5]->
                                           constraint).super__Vector_base<int,_std::allocator<int>_>
                                           ._M_impl.super__Vector_impl_data +
                                (long)uStack_38._4_4_ * 4));
      iVar2 = *(int *)(*(long *)&((this->TableInfoList).
                                  super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar5]->constraint).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + (long)uStack_38._4_4_ * 4);
      if (iVar2 == 3) {
        std::operator<<((ostream *)&std::cout,"\tprimary key ");
        iVar2 = *(int *)(*(long *)&((this->TableInfoList).
                                    super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar5]->constraint).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data + (long)uStack_38._4_4_ * 4);
      }
      if (iVar2 == 4) {
        poVar3 = std::operator<<((ostream *)&std::cout,"\tindex ");
        iVar4 = std::
                _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&((this->TableInfoList).
                         super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar5]->indexInfo)._M_t,
                       (key_type *)((long)&uStack_38 + 4));
        std::operator<<(poVar3,(string *)&iVar4._M_node[1]._M_parent);
      }
      std::operator<<((ostream *)&std::cout,"\n");
      iVar2 = uStack_38._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void catalog::print(){
    for(int i = 0 ; i < tableNumber ; i ++){
        std::cout<<"tableName : "<<TableInfoList[i]->tableName;
        std::cout<<"\tattributeNum : "<<TableInfoList[i]->attributeNum<<std::endl;
        for(int j = 0 ; j < TableInfoList[i]->attributeNum; j ++){
            std::cout<<TableInfoList[i]->attributeName[j] << "\t"<<TableInfoList[i]->type[j] << "\t"<<TableInfoList[i]->constraint[j];
            if(TableInfoList[i]->constraint[j] == 3)std::cout<<"\tprimary key ";
            if(TableInfoList[i]->constraint[j] == 4)std::cout<<"\tindex "<<TableInfoList[i]->indexInfo.find(j)->second;
            std::cout<<"\n";
        }
        //std::cout <<"file_offset :"<<file_offset[i]<<std::endl;
    }
}